

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyEquivalenceInfo
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,
          PropertyEquivalenceInfo *info)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  PropertyIndex PVar4;
  int iVar6;
  undefined4 *puVar7;
  ushort uVar8;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<int> *pDStack_30;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  ushort uVar5;
  
  local_40 = propertyRecord;
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&stack0xffffffffffffffd0,
                     (int *)((long)&propertyRecord_local + 4));
  if ((bVar3) && ((pDStack_30->Attributes & 8) == 0)) {
    iVar6 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_30);
    if (iVar6 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xeb,
                                  "(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot)"
                                  ,"We don\'t support equivalent object type spec on accessors.");
      if (!bVar3) goto LAB_00d99cf1;
      *puVar7 = 0;
    }
    iVar6 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_30);
    if (0xfffe < iVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xec,
                                  "(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax)"
                                  ,
                                  "We don\'t support equivalent object type spec on big property indexes."
                                 );
      if (!bVar3) goto LAB_00d99cf1;
      *puVar7 = 0;
    }
    iVar6 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_30);
    if (iVar6 < 0xffff) {
      uVar8 = (ushort)iVar6;
      if (uVar8 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                    ,0xaf,"(slotIndex != Constants::NoSlot)",
                                    "slotIndex != Constants::NoSlot");
        if (!bVar3) {
LAB_00d99cf1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar5 = -uVar1;
      if (uVar8 < uVar1) {
        uVar5 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      PVar4 = uVar5 + uVar8;
    }
    else {
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      PVar4 = 0xffff;
    }
    info->slotIndex = PVar4;
    info->isAuxSlot = (int)(uint)uVar1 <= iVar6;
    info->isWritable = (bool)(pDStack_30->Attributes >> 2 & 1);
    bVar3 = PVar4 != 0xffff;
  }
  else {
    info->slotIndex = 0xffff;
    info->isAuxSlot = false;
    info->isWritable = false;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot, "We don't support equivalent object type spec on accessors.");
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax, "We don't support equivalent object type spec on big property indexes.");
            T propertyIndex = descriptor->template GetDataPropertyIndex<false>();
            info.slotIndex = propertyIndex <= Constants::PropertyIndexMax ?
                AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(propertyIndex)) : Constants::NoSlot;
            info.isAuxSlot = propertyIndex >= GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }